

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

int Wlc_NtkCreateLevels(Wlc_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  uVar1 = p->iObj;
  uVar5 = (ulong)uVar1;
  if ((p->vLevels).nCap < (int)uVar1) {
    piVar4 = (p->vLevels).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    (p->vLevels).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vLevels).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vLevels).pArray,0,uVar5 * 4);
  }
  (p->vLevels).nSize = uVar1;
  if (1 < p->iObj) {
    lVar7 = 1;
    lVar8 = 0x18;
    do {
      if (p->nObjsAlloc <= lVar7) goto LAB_003692e6;
      Wlc_NtkCreateLevels_rec(p,(Wlc_Obj_t *)(&p->pObjs->field_0x0 + lVar8));
      lVar7 = lVar7 + 1;
      uVar5 = (ulong)p->iObj;
      lVar8 = lVar8 + 0x18;
    } while (lVar7 < (long)uVar5);
    if (1 < p->iObj) {
      lVar7 = 1;
      lVar8 = 7;
      do {
        if (p->nObjsAlloc <= lVar7) goto LAB_003692e6;
        if (((*(ushort *)((long)p->pObjs + lVar8 * 4 + -4) & 0x3d) != 1) &&
           (*(int *)(&p->pObjs->field_0x0 + lVar8 * 4) != 0)) {
          if ((p->vLevels).nSize <= lVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          piVar4 = (p->vLevels).pArray + lVar7;
          *piVar4 = *piVar4 + 1;
          uVar5 = (ulong)(uint)p->iObj;
        }
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 6;
      } while (lVar7 < (int)uVar5);
    }
    uVar5 = (ulong)(uint)(p->vLevels).nSize;
  }
  if ((int)uVar5 == 0) {
    iVar3 = 0;
  }
  else {
    piVar4 = (p->vLevels).pArray;
    iVar3 = *piVar4;
    if (1 < (int)uVar5) {
      uVar6 = 1;
      do {
        iVar2 = piVar4[uVar6];
        if (iVar3 <= iVar2) {
          iVar3 = iVar2;
        }
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
  }
  uVar1 = (p->vFfs2).nSize;
  uVar5 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    lVar7 = 0;
    do {
      if ((int)uVar5 <= lVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (p->vFfs2).pArray[lVar7];
      if (((long)iVar2 < 1) || (p->nObjsAlloc <= iVar2)) {
LAB_003692e6:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((p->vLevels).nSize <= iVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vLevels).pArray[iVar2] = iVar3 + 1;
      lVar7 = lVar7 + 1;
      uVar5 = (ulong)(p->vFfs2).nSize;
    } while (lVar7 < (long)uVar5);
  }
  return iVar3 + 1;
}

Assistant:

int Wlc_NtkCreateLevels( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;  int i, LeveMax = 0;
    Vec_IntFill( &p->vLevels, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObj( p, pObj, i )
        Wlc_NtkCreateLevels_rec( p, pObj );
    Wlc_NtkForEachObj( p, pObj, i )
        if ( !Wlc_ObjIsCi(pObj) && Wlc_ObjFaninNum(pObj) )
            Vec_IntAddToEntry( &p->vLevels, i, 1 );
    LeveMax = Vec_IntFindMax( &p->vLevels );
    Wlc_NtkForEachFf2( p, pObj, i )
        Vec_IntWriteEntry( &p->vLevels, Wlc_ObjId(p, pObj), LeveMax+1 );
    //Wlc_NtkPrintObjects( p ); 
    return LeveMax+1;
}